

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void pop_scope(JSParseState *s)

{
  JSFunctionDef *pJVar1;
  JSVarScope *pJVar2;
  int iVar3;
  uint uVar4;
  JSFunctionDef *fd;
  
  pJVar1 = s->cur_func;
  if (pJVar1 != (JSFunctionDef *)0x0) {
    iVar3 = pJVar1->scope_level;
    emit_op(s,0xb3);
    emit_u16(s,(uint16_t)iVar3);
    pJVar2 = pJVar1->scopes;
    uVar4 = pJVar2[iVar3].parent;
    pJVar1->scope_level = uVar4;
    for (; -1 < (int)uVar4; uVar4 = pJVar2[uVar4].parent) {
      iVar3 = pJVar2[uVar4].first;
      if (-1 < iVar3) goto LAB_0014dc66;
    }
    iVar3 = -1;
LAB_0014dc66:
    pJVar1->scope_first = iVar3;
  }
  return;
}

Assistant:

static void pop_scope(JSParseState *s) {
    if (s->cur_func) {
        /* disable scoped variables */
        JSFunctionDef *fd = s->cur_func;
        int scope = fd->scope_level;
        emit_op(s, OP_leave_scope);
        emit_u16(s, scope);
        fd->scope_level = fd->scopes[scope].parent;
        fd->scope_first = get_first_lexical_var(fd, fd->scope_level);
    }
}